

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void container_suite::test_array(void)

{
  view_type *pvVar1;
  value *pvVar2;
  char input [14];
  decoder_type decoder;
  value local_178 [2];
  value_type local_170 [16];
  basic_decoder<char> local_160;
  
  builtin_memcpy(local_170 + 8,"alse]",6);
  builtin_memcpy(local_170,"[true, f",8);
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<14ul>
            (&local_160,(value_type (*) [14])local_170);
  local_178[0] = local_160.current.code;
  pvVar2 = local_178 + 1;
  local_178[1] = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x998,"void container_suite::test_array()",local_178,pvVar2);
  pvVar1 = &local_160.current.view;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[2]>
            ("decoder.literal()","\"[\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x999,"void container_suite::test_array()",pvVar1,"[");
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[13]>
            ("decoder.tail()","\"true, false]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x99a,"void container_suite::test_array()",&local_160,"true, false]");
  trial::protocol::json::detail::basic_decoder<char>::next(&local_160);
  local_178[0] = local_160.current.code;
  local_178[1] = 6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::true_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x99c,"void container_suite::test_array()",local_178,pvVar2);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[5]>
            ("decoder.literal()","\"true\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x99d,"void container_suite::test_array()",pvVar1,"true");
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[9]>
            ("decoder.tail()","\", false]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x99e,"void container_suite::test_array()",&local_160,", false]");
  trial::protocol::json::detail::basic_decoder<char>::next(&local_160);
  local_178[0] = local_160.current.code;
  local_178[1] = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::error_value_separator",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x9a0,"void container_suite::test_array()",local_178,pvVar2);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[2]>
            ("decoder.literal()","\",\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x9a1,"void container_suite::test_array()",pvVar1,",");
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[8]>
            ("decoder.tail()","\" false]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x9a2,"void container_suite::test_array()",&local_160," false]");
  trial::protocol::json::detail::basic_decoder<char>::next(&local_160);
  local_178[0] = local_160.current.code;
  local_178[1] = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::false_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x9a4,"void container_suite::test_array()",local_178,local_178 + 1);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[6]>
            ("decoder.literal()","\"false\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x9a5,"void container_suite::test_array()",pvVar1,"false");
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[2]>
            ("decoder.tail()","\"]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x9a6,"void container_suite::test_array()",&local_160,"]");
  trial::protocol::json::detail::basic_decoder<char>::next(&local_160);
  local_178[0] = local_160.current.code;
  local_178[1] = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x9a8,"void container_suite::test_array()",local_178,local_178 + 1);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[2]>
            ("decoder.literal()","\"]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x9a9,"void container_suite::test_array()",pvVar1,"]");
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::core::detail::span<char>,char[1]>
            ("decoder.tail()","\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x9aa,"void container_suite::test_array()",&local_160,"");
  trial::protocol::json::detail::basic_decoder<char>::next(&local_160);
  local_178[0] = local_160.current.code;
  local_178[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x9ac,"void container_suite::test_array()",local_178,local_178 + 1);
  return;
}

Assistant:

void test_array()
{
    const char input[] = "[true, false]";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::begin_array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "[");
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.tail(), "true, false]");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::true_value);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "true");
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.tail(), ", false]");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_value_separator); // Not really an error yet
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), ",");
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.tail(), " false]");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::false_value);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "false");
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.tail(), "]");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end_array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal(), "]");
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.tail(), "");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}